

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O2

void __thiscall Memory::CacheAllocator::ZeroAll(CacheAllocator *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ArenaData *this_00;
  CacheAllocator *pCVar3;
  
  this_00 = (ArenaData *)(this + 0x10);
  ArenaData::UpdateCacheBlock(this_00);
  while (this_00 = (ArenaData *)this_00->bigBlocks, this_00 != (ArenaData *)0x0) {
    memset(&this_00->cacheBlockCurrent,0,(size_t)this_00->pageAllocator);
  }
  pCVar3 = this + 0x18;
  while (pCVar3 = *(CacheAllocator **)pCVar3, pCVar3 != (CacheAllocator *)0x0) {
    memset(pCVar3 + 0x20,0,*(size_t *)(pCVar3 + 0x18));
  }
  puVar2 = *(undefined8 **)(this + 0x20);
  while (puVar2 != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*puVar2;
    memset(puVar2 + 2,0,puVar2[1]);
    puVar2 = puVar1;
  }
  return;
}

Assistant:

void CacheAllocator::ZeroAll()
{
    UpdateCacheBlock();
    BigBlock *blockp = this->bigBlocks;
    while (blockp != NULL)
    {
        memset(blockp->GetBytes(), 0, blockp->currentByte);
        blockp = blockp->nextBigBlock;
    }
    blockp = this->fullBlocks;
    while (blockp != NULL)
    {
        memset(blockp->GetBytes(), 0, blockp->currentByte);
        blockp = blockp->nextBigBlock;
    }

    ArenaMemoryBlock * memoryBlock = this->mallocBlocks;
    while (memoryBlock != nullptr)
    {
        ArenaMemoryBlock * next = memoryBlock->next;
        memset(memoryBlock->GetBytes(), 0, memoryBlock->nbytes);
        memoryBlock = next;
    }
}